

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::eval_selection_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<bool,_4> *pVVar3;
  Vector<bool,_4> res_1;
  Vector<bool,_4> res;
  undefined4 local_5c;
  float local_58 [4];
  float local_48 [4];
  Vector<float,_4> res_2;
  float local_28 [10];
  
  fVar1 = c->in[0].m_data[2];
  local_48[0] = c->in[1].m_data[3];
  local_48[1] = c->in[1].m_data[2];
  local_48[2] = c->in[1].m_data[1];
  local_48[3] = c->in[1].m_data[0];
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  res.m_data[3] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] =
         local_28[lVar2 + 4] <= local_48[lVar2] && local_48[lVar2] != local_28[lVar2 + 4];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_58[0] = c->in[2].m_data[0];
  local_58[1] = c->in[2].m_data[3];
  local_58[2] = c->in[2].m_data[2];
  local_58[3] = c->in[2].m_data[1];
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  res_1.m_data[3] = false;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = local_28[lVar2] <= local_58[lVar2] && local_58[lVar2] != local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar3 = &res_1;
  if (0.0 < fVar1) {
    pVVar3 = &res;
  }
  local_5c = *(undefined4 *)pVVar3->m_data;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)(int)*(char *)((long)local_58 + lVar2 + -4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = res_2.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_2.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_bvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(3, 2, 1, 0), Vec4(0.0f, 0.0f, 0.0f, 0.0f)),	greaterThan(c.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }